

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall Compiler::Compiler(Compiler *this,string *_filePath)

{
  Lexer *pLVar1;
  Parser *this_00;
  string local_48;
  string *local_18;
  string *_filePath_local;
  Compiler *this_local;
  
  local_18 = _filePath;
  _filePath_local = (string *)this;
  std::__cxx11::string::string((string *)&this->filePath);
  std::__cxx11::string::operator=((string *)&this->filePath,(string *)_filePath);
  pLVar1 = (Lexer *)operator_new(0x60);
  Lexer::Lexer(pLVar1);
  this->lexer = pLVar1;
  pLVar1 = this->lexer;
  std::__cxx11::string::string((string *)&local_48,(string *)&this->filePath);
  Lexer::lex(pLVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (Parser *)operator_new(0x20);
  Syntax::Parser::Parser(this_00,this->lexer);
  this->parser = this_00;
  this->symTabGenerator = (STGV *)0x0;
  this->typeChecker = (TCV *)0x0;
  return;
}

Assistant:

Compiler::Compiler(std::string _filePath) {
    this->filePath = std::move(_filePath);
    this->lexer = new Lexer();
    lexer->lex(filePath);
    this->parser = new Syntax::Parser(lexer);
    this->symTabGenerator = nullptr;
    this->typeChecker = nullptr;
}